

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

int speak_pa_callback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                     PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                     void *userData)

{
  int i;
  short *s;
  short *p;
  SpeakData *data;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  int local_4;
  
  if (userData == (void *)0x0) {
    local_4 = 2;
  }
  else if (*userData == 0) {
    local_4 = 2;
  }
  else if (((*(byte *)((long)userData + 0x20) & 1) == 0) &&
          ((*(byte *)((long)userData + 0x21) & 1) == 0)) {
    if ((ulong)(*(long *)((long)userData + 0x10) << 10) < *(ulong *)((long)userData + 8)) {
      s = (short *)(*userData + *(long *)((long)userData + 0x10) * 0x800);
      p = (short *)outputBuffer;
      for (i = 0; i < 0x400; i = i + 1) {
        *p = *s;
        if (((*(byte *)((long)userData + 0x20) & 1) != 0) ||
           ((*(byte *)((long)userData + 0x21) & 1) != 0)) {
          return 2;
        }
        s = s + 1;
        p = p + 1;
      }
      *(long *)((long)userData + 0x10) = *(long *)((long)userData + 0x10) + 1;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int speak_pa_callback(
	const void *inputBuffer,
	void *outputBuffer,
	unsigned long framesPerBuffer,
	const PaStreamCallbackTimeInfo *timeInfo,
	PaStreamCallbackFlags statusFlags,
	void *userData)
{
	SpeakData *data = (SpeakData *)userData;
	if (data == NULL)
	{
		return paAbort;
	}

	if (data->data == NULL)
	{
		return paAbort;
	}

	if (data->stop || data->pause)
	{
		return paAbort;
	}

	if (data->counter * OPENJTALK_BLOCKSIZE >= data->length)
	{
		return paComplete;
	}

	short *p = (short *)outputBuffer;
	short *s = (short *)data->data + OPENJTALK_BLOCKSIZE * data->counter;
	for (int i = 0; i < OPENJTALK_BLOCKSIZE; i++)
	{
		*p++ = *s++;
		if (data->stop || data->pause)
		{
			return paAbort;
		}
	}
	data->counter++;
	return paContinue;
}